

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_prov.c
# Opt level: O0

int hmac_set_ctx_params(void *vmacctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  void *pvVar3;
  EVP_MD *md;
  long in_RSI;
  undefined8 *in_RDI;
  int flags;
  OSSL_PARAM *p;
  OSSL_LIB_CTX *ctx;
  hmac_data_st *macctx;
  HMAC_CTX *in_stack_ffffffffffffffa8;
  OSSL_PARAM *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  OSSL_PARAM *in_stack_ffffffffffffffc0;
  char *file;
  uint in_stack_ffffffffffffffc8;
  int iVar4;
  int local_4;
  
  ossl_prov_ctx_get0_libctx((PROV_CTX *)*in_RDI);
  iVar4 = 0;
  if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = ossl_prov_digest_load_from_params
                      ((PROV_DIGEST *)(ulong)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (OSSL_LIB_CTX *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                      );
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = set_flag((OSSL_PARAM *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                       (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                       (int *)in_stack_ffffffffffffffb0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        iVar1 = set_flag((OSSL_PARAM *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                         (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                         (int *)in_stack_ffffffffffffffb0);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          if (iVar4 != 0) {
            HMAC_CTX_set_flags((HMAC_CTX *)in_RDI[1],(long)iVar4);
          }
          pOVar2 = OSSL_PARAM_locate_const
                             (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          if (pOVar2 != (OSSL_PARAM *)0x0) {
            if (pOVar2->data_type != 5) {
              return 0;
            }
            if (in_RDI[6] != 0) {
              CRYPTO_secure_clear_free
                        (in_stack_ffffffffffffffc0,
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (char *)in_stack_ffffffffffffffb0,
                         (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
            }
            if (pOVar2->data_size == 0) {
              file = (char *)0x1;
            }
            else {
              file = (char *)pOVar2->data_size;
            }
            pvVar3 = CRYPTO_secure_malloc
                               (CONCAT44(iVar4,in_stack_ffffffffffffffc8),file,
                                in_stack_ffffffffffffffbc);
            in_RDI[5] = pvVar3;
            if (in_RDI[5] == 0) {
              return 0;
            }
            memcpy((void *)in_RDI[5],pOVar2->data,pOVar2->data_size);
            in_RDI[6] = pOVar2->data_size;
            in_stack_ffffffffffffffa8 = (HMAC_CTX *)in_RDI[1];
            in_stack_ffffffffffffffb0 = (OSSL_PARAM *)pOVar2->data;
            iVar4 = (int)pOVar2->data_size;
            md = ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 2));
            iVar4 = HMAC_Init_ex(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,iVar4,
                                 (EVP_MD *)md,(ENGINE *)0x0);
            if (iVar4 == 0) {
              return 0;
            }
          }
          pOVar2 = OSSL_PARAM_locate_const
                             (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          if ((pOVar2 == (OSSL_PARAM *)0x0) ||
             (iVar4 = OSSL_PARAM_get_size_t
                                (in_stack_ffffffffffffffb0,(size_t *)in_stack_ffffffffffffffa8),
             iVar4 != 0)) {
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int hmac_set_ctx_params(void *vmacctx, const OSSL_PARAM params[])
{
    struct hmac_data_st *macctx = vmacctx;
    OSSL_LIB_CTX *ctx = PROV_LIBCTX_OF(macctx->provctx);
    const OSSL_PARAM *p;
    int flags = 0;

    if (params == NULL)
        return 1;

    if (!ossl_prov_digest_load_from_params(&macctx->digest, params, ctx))
        return 0;

    if (!set_flag(params, OSSL_MAC_PARAM_DIGEST_NOINIT, EVP_MD_CTX_FLAG_NO_INIT,
                  &flags))
        return 0;
    if (!set_flag(params, OSSL_MAC_PARAM_DIGEST_ONESHOT, EVP_MD_CTX_FLAG_ONESHOT,
                  &flags))
        return 0;
    if (flags)
        HMAC_CTX_set_flags(macctx->ctx, flags);

    if ((p = OSSL_PARAM_locate_const(params, OSSL_MAC_PARAM_KEY)) != NULL) {
        if (p->data_type != OSSL_PARAM_OCTET_STRING)
            return 0;

        if (macctx->keylen > 0)
            OPENSSL_secure_clear_free(macctx->key, macctx->keylen);
        /* Keep a copy of the key if we need it for TLS HMAC */
        macctx->key = OPENSSL_secure_malloc(p->data_size > 0 ? p->data_size : 1);
        if (macctx->key == NULL)
            return 0;
        memcpy(macctx->key, p->data, p->data_size);
        macctx->keylen = p->data_size;

        if (!HMAC_Init_ex(macctx->ctx, p->data, p->data_size,
                          ossl_prov_digest_md(&macctx->digest),
                          NULL /* ENGINE */))
            return 0;

    }
    if ((p = OSSL_PARAM_locate_const(params,
                                     OSSL_MAC_PARAM_TLS_DATA_SIZE)) != NULL) {
        if (!OSSL_PARAM_get_size_t(p, &macctx->tls_data_size))
            return 0;
    }
    return 1;
}